

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_gamemtls_lib.cxx
# Opt level: O0

void __thiscall xray_re::xr_gamemtl::load(xr_gamemtl *this,xr_reader *r)

{
  uint32_t uVar1;
  size_t sVar2;
  float fVar3;
  xr_reader *r_local;
  xr_gamemtl *this_local;
  
  sVar2 = xr_reader::find_chunk(r,0x1000);
  if (sVar2 == 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_gamemtls_lib.cxx"
                  ,0x11,"void xray_re::xr_gamemtl::load(xr_reader &)");
  }
  uVar1 = xr_reader::r_u32(r);
  this->id = uVar1;
  xr_reader::r_sz(r,&this->name);
  xr_reader::debug_find_chunk(r);
  sVar2 = xr_reader::find_chunk(r,0x1005);
  if (sVar2 != 0) {
    xr_reader::r_sz(r,&this->desc);
    xr_reader::debug_find_chunk(r);
  }
  sVar2 = xr_reader::find_chunk(r,0x1001);
  if (sVar2 == 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_gamemtls_lib.cxx"
                  ,0x1c,"void xray_re::xr_gamemtl::load(xr_reader &)");
  }
  uVar1 = xr_reader::r_u32(r);
  this->flags = uVar1;
  xr_reader::debug_find_chunk(r);
  sVar2 = xr_reader::find_chunk(r,0x1002);
  if (sVar2 == 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_gamemtls_lib.cxx"
                  ,0x21,"void xray_re::xr_gamemtl::load(xr_reader &)");
  }
  fVar3 = xr_reader::r_float(r);
  this->friction = fVar3;
  fVar3 = xr_reader::r_float(r);
  this->damping = fVar3;
  fVar3 = xr_reader::r_float(r);
  this->spring = fVar3;
  fVar3 = xr_reader::r_float(r);
  this->bouncing_start_velocity = fVar3;
  fVar3 = xr_reader::r_float(r);
  this->bounce = fVar3;
  xr_reader::debug_find_chunk(r);
  sVar2 = xr_reader::find_chunk(r,0x1003);
  if (sVar2 == 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_gamemtls_lib.cxx"
                  ,0x2a,"void xray_re::xr_gamemtl::load(xr_reader &)");
  }
  fVar3 = xr_reader::r_float(r);
  this->shoot_factor = fVar3;
  fVar3 = xr_reader::r_float(r);
  this->bounce_damage_factor = fVar3;
  fVar3 = xr_reader::r_float(r);
  this->vis_transparency_factor = fVar3;
  fVar3 = xr_reader::r_float(r);
  this->snd_occlusion_factor = fVar3;
  xr_reader::debug_find_chunk(r);
  sVar2 = xr_reader::r_chunk<float>(r,0x1004,&this->flotation_factor);
  if (sVar2 == 0) {
    this->flotation_factor = 1.0;
  }
  sVar2 = xr_reader::r_chunk<float>(r,0x1006,&this->injurious_speed);
  if (sVar2 == 0) {
    this->injurious_speed = 0.0;
  }
  return;
}

Assistant:

void xr_gamemtl::load(xr_reader& r)
{
	if (!r.find_chunk(GAMEMTL_CHUNK_MAIN))
		xr_not_expected();
	id = r.r_u32();
	r.r_sz(name);
	r.debug_find_chunk();

	if (r.find_chunk(GAMEMTL_CHUNK_DESC)) {
		r.r_sz(desc);
		r.debug_find_chunk();
	}

	if (!r.find_chunk(GAMEMTL_CHUNK_FLAGS))
		xr_not_expected();
	flags = r.r_u32();
	r.debug_find_chunk();

	if (!r.find_chunk(GAMEMTL_CHUNK_PHYSICS))
		xr_not_expected();
	friction = r.r_float();
	damping = r.r_float();
	spring = r.r_float();
	bouncing_start_velocity = r.r_float();
	bounce = r.r_float();
	r.debug_find_chunk();

	if (!r.find_chunk(GAMEMTL_CHUNK_FACTORS))
		xr_not_expected();
	shoot_factor = r.r_float();
	bounce_damage_factor = r.r_float();
	vis_transparency_factor = r.r_float();
	snd_occlusion_factor = r.r_float();
	r.debug_find_chunk();

	//in build 1580 not present
	if (!r.r_chunk<float>(GAMEMTL_CHUNK_FLOTATION, flotation_factor))
		flotation_factor = 1.0f;

	//in build 1865 not present
	if (!r.r_chunk<float>(GAMEMTL_CHUNK_INJURY, injurious_speed))
		injurious_speed = 0.0f;
}